

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian_opt.cpp
# Opt level: O0

void compute_response_layer_unconditional_strided(response_layer *layer,integral_image *iimage)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int rows;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  integral_image *in_RSI;
  int *in_RDI;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  float Dxy_1;
  int y_2;
  int j_2;
  int x_3;
  float Dxy;
  float top_right;
  float top_left;
  int x_2;
  int ii;
  float bottom_right;
  float bottom_left;
  int x_1;
  int y_1;
  int j_1;
  int i_1;
  int i_offset;
  int i_unroll;
  float Dyy;
  float Dxx;
  int y;
  int j;
  int x;
  int ind;
  int i;
  int Dyy_row_stride;
  int Dxx_col_stride;
  int Dxy_stride;
  float inv_area;
  int border;
  int lobe;
  int width;
  int height;
  int filter_size;
  int step;
  bool *laplacian;
  float *response;
  int local_a0;
  int local_88;
  float local_84;
  float local_80;
  int local_74;
  int local_70;
  int local_6c;
  int local_58;
  int local_50;
  int local_4c;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  lVar4 = *(long *)(in_RDI + 4);
  lVar12 = *(long *)(in_RDI + 6);
  iVar1 = in_RDI[3];
  iVar11 = *in_RDI;
  iVar2 = in_RDI[2];
  iVar3 = in_RDI[1];
  rows = iVar11 / 3;
  iVar7 = (iVar11 + -1) / 2;
  fVar13 = 1.0 / (float)(iVar11 * iVar11);
  iVar8 = (rows + 1) / iVar1;
  local_50 = 0;
  for (local_4c = 0; local_4c < iVar2; local_4c = local_4c + 1) {
    iVar9 = local_4c * iVar1;
    for (local_58 = 0; local_58 < iVar3; local_58 = local_58 + 1) {
      iVar10 = local_58 * iVar1;
      fVar14 = box_integral_unconditional
                         (in_RSI,(iVar9 - rows) + 1,iVar10 - iVar7,rows * 2 + -1,iVar11);
      auVar18._0_4_ =
           box_integral_unconditional
                     (in_RSI,(iVar9 - rows) + 1,iVar10 - rows / 2,rows * 2 + -1,rows);
      auVar18._4_60_ = extraout_var;
      auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar18._0_16_,ZEXT416((uint)fVar14));
      fVar14 = box_integral_unconditional
                         (in_RSI,iVar9 - iVar7,(iVar10 - rows) + 1,iVar11,rows * 2 + -1);
      auVar19._0_4_ =
           box_integral_unconditional
                     (in_RSI,iVar9 - rows / 2,(iVar10 - rows) + 1,rows,rows * 2 + -1);
      auVar19._4_60_ = extraout_var_00;
      auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar19._0_16_,ZEXT416((uint)fVar14));
      fVar14 = fVar13 * auVar5._0_4_;
      fVar15 = fVar13 * auVar6._0_4_;
      *(float *)(lVar4 + (long)local_50 * 4) = fVar14 * fVar15;
      *(bool *)(lVar12 + local_50) = 0.0 <= fVar14 + fVar15;
      local_50 = local_50 + 1;
    }
  }
  for (local_6c = 0; local_6c < iVar8; local_6c = local_6c + 1) {
    for (local_70 = local_6c; local_70 < iVar2 + iVar8 * -0xc + 1; local_70 = iVar8 * 0xc + local_70
        ) {
      for (local_74 = 0; local_74 < iVar3; local_74 = local_74 + 1) {
        iVar11 = local_74 * iVar1;
        local_80 = box_integral_unconditional
                             (in_RSI,local_70 * iVar1 - rows,iVar11 - rows,rows,rows);
        local_84 = box_integral_unconditional(in_RSI,local_70 * iVar1 - rows,iVar11 + 1,rows,rows);
        for (local_88 = local_70; local_88 < local_70 + iVar8 * 0xc; local_88 = iVar8 + local_88) {
          fVar15 = box_integral_unconditional(in_RSI,local_88 * iVar1 + 1,iVar11 - rows,rows,rows);
          fVar16 = box_integral_unconditional(in_RSI,local_88 * iVar1 + 1,iVar11 + 1,rows,rows);
          fVar14 = fVar13 * (((local_84 + fVar15) - local_80) - fVar16);
          lVar12 = (long)(local_88 * iVar3 + local_74);
          auVar5 = vfmadd213ss_fma(ZEXT416((uint)fVar14),ZEXT416((uint)-(fVar14 * 0.81)),
                                   ZEXT416(*(uint *)(lVar4 + lVar12 * 4)));
          *(int *)(lVar4 + lVar12 * 4) = auVar5._0_4_;
          local_84 = fVar16;
          local_80 = fVar15;
        }
      }
    }
    for (; local_70 < iVar2; local_70 = iVar8 + local_70) {
      iVar11 = local_70 * iVar1;
      for (local_a0 = 0; local_a0 < iVar3; local_a0 = local_a0 + 1) {
        iVar7 = local_a0 * iVar1;
        fVar14 = box_integral_unconditional(in_RSI,iVar11 - rows,iVar7 + 1,rows,rows);
        fVar15 = box_integral_unconditional(in_RSI,iVar11 + 1,iVar7 - rows,rows,rows);
        fVar16 = box_integral_unconditional(in_RSI,iVar11 - rows,iVar7 - rows,rows,rows);
        fVar17 = box_integral_unconditional(in_RSI,iVar11 + 1,iVar7 + 1,rows,rows);
        fVar14 = fVar13 * (((fVar14 + fVar15) - fVar16) - fVar17);
        lVar12 = (long)(local_70 * iVar3 + local_a0);
        auVar5 = vfmadd213ss_fma(ZEXT416((uint)fVar14),ZEXT416((uint)-(fVar14 * 0.81)),
                                 ZEXT416(*(uint *)(lVar4 + lVar12 * 4)));
        *(int *)(lVar4 + lVar12 * 4) = auVar5._0_4_;
      }
    }
  }
  return;
}

Assistant:

void compute_response_layer_unconditional_strided(struct response_layer *layer, struct integral_image *iimage) {
    /*
    base function: compute_response_layer_unconditional

    optimizations:
        - Computes Dxy in a strided manner (reusing parts), as a result eliminates unnecessary
            recomputations
    */

    float *response = layer->response;
    bool *laplacian = layer->laplacian;

    int step = layer->step;
    int filter_size = layer->filter_size;
    int height = layer->height;
    int width = layer->width;

    int lobe = filter_size/3;
    int border = (filter_size-1)/2;
    float inv_area = 1.f/(filter_size*filter_size);

    int Dxy_stride = (lobe+1)/step;
    // printf("\nDxy_stride: lobe+1:%d step:%d Dxy_stride:%d\n", lobe+1, step, Dxy_stride);

    // int Dxx_col_stride = lobe/step;
    // printf("Dyy_row_stride/Dxx_col_stride: lobe:%d step:%d Dxx_col_stride:%d\n", lobe, step, Dxx_col_stride);

    int Dxx_col_stride = (2*lobe)/step;
    // printf("2*Dyy_row_stride/2*Dxx_col_stride: lobe:%d step:%d 2*Dxx_col_stride:%d\n", lobe, step, Dxx_col_stride);

    // int Dxx_row_stride = (2*lobe - 1)/step;
    // printf("Dyy_col_stride/Dxx_row_stride: 2*lobe-1:%d step:%d Dxx_row_stride:%d\n", 2*lobe-1, step, Dxx_row_stride);

    // int Dyy_col_stride = (2*lobe - 1)/step;
    int Dyy_row_stride = (2*lobe)/step;

    for (int i = 0, ind = 0; i < height; ++i) {
        int x = i*step;
        for (int j = 0; j < width; ++j, ind++) {
            // Image coordinates
            int y = j*step;

            // Calculate Dxx, Dyy, Dxy with Box Filter
            float Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                    - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
            float Dyy = box_integral_unconditional(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                    - 3 * box_integral_unconditional(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);

            // Normalize Responses with inverse area
            Dxx *= inv_area;
            Dyy *= inv_area;

            // Calculate Determinant
            response[ind] = Dxx * Dyy;
            // Calculate Laplacian
            laplacian[ind] = (Dxx + Dyy >= 0);
        }
    }
    /*
    {
        int i_unroll = 24;
    // printf("\n");
    // printf("Dyy_row_stride %d step %d \n", Dyy_row_stride, step);
    // for (int i_offset=0; i_offset<Dyy_row_stride-i_unroll+1; i_offset+=i_unroll) {
        int i_offset=0;
        for (; i_offset<Dyy_row_stride; i_offset+=1) {
            // printf("j_offset: %d - %d ", j_offset, j_offset+j_unroll-1);
            int i = i_offset;
            for (; i < height-(Dyy_row_stride*i_unroll)+1; i+=Dyy_row_stride*i_unroll) {

                for (int j = 0; j < width; j++) {
                    int y = j*step;
                    int x = i*step;
                    for (int ii = i; ii<i+(Dyy_row_stride*i_unroll); ii+=Dyy_row_stride) {
                        // Image coordinates
                        int x = ii*step;

                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        float Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                                - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                        float Dyy = box_integral_unconditional(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                                - 3 * box_integral_unconditional(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);

                        // Normalize Responses with inverse area
                        Dxx *= inv_area;
                        Dyy *= inv_area;

                        // Calculate Determinant
                        response[ii*width + j] = Dxx * Dyy;
                        // Calculate Laplacian
                        laplacian[ii*width + j] = (Dxx + Dyy >= 0);
                    }
                }
            }

            for (; i < height; i+=Dxy_stride) {
                int x = i*step;
                for (int j = 0; j < width; j++) {
                    // Image coordinates
                    int y = j*step;

                    // Calculate Dxx, Dyy, Dxy with Box Filter
                    float Dxx = box_integral_unconditional(iimage, x - lobe + 1, y - border, 2*lobe - 1, filter_size)
                            - 3 * box_integral_unconditional(iimage, x - lobe + 1, y - lobe / 2, 2*lobe - 1, lobe);
                    float Dyy = box_integral_unconditional(iimage, x - border, y - lobe + 1, filter_size, 2*lobe - 1)
                            - 3 * box_integral_unconditional(iimage, x - lobe / 2, y - lobe + 1, lobe, 2*lobe - 1);

                    // Normalize Responses with inverse area
                    Dxx *= inv_area;
                    Dyy *= inv_area;

                    // Calculate Determinant
                    response[i*width + j] = Dxx * Dyy;
                    // Calculate Laplacian
                    laplacian[i*width + j] = (Dxx + Dyy >= 0);

                }

            }
        }
    }
    */



    // strided Dxy
    {
        int i_unroll = 12;
    // printf("\n");
    // printf("Dxy_stride %d step %d \n", Dxy_stride, step);
    // for (int i_offset=0; i_offset<Dxy_stride-i_unroll+1; i_offset+=i_unroll) {
        int i_offset=0;
        /**/
        for (; i_offset<Dxy_stride; i_offset+=1) {
            // printf("j_offset: %d - %d ", j_offset, j_offset+j_unroll-1);
            int i = i_offset;
            for (; i < height-(Dxy_stride*i_unroll)+1; i+=Dxy_stride*i_unroll) {

                for (int j = 0; j < width; j++) {
                    int y = j*step;
                    int x = i*step;
                    float bottom_left = box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe);
                    float bottom_right = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe);
                    for (int ii = i; ii<i+(Dxy_stride*i_unroll); ii+=Dxy_stride) {
                        // Image coordinates
                        int x = ii*step;

                        float top_left = bottom_left;//box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe);
                        float top_right = bottom_right;//box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe);

                        bottom_left = box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe);
                        bottom_right = box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);


                        // Calculate Dxx, Dyy, Dxy with Box Filter
                        float Dxy = top_right //box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                                + bottom_left //box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                                - top_left //box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                                - bottom_right; //box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                        // printf("i:%d j:%d ii:%d jj:%d New Filter: %d %d | %d %d | %d %d | %d %d\n", i, j, ii, jj, x - lobe, y + 1, x + 1, y - lobe, x - lobe, y - lobe, x + 1, y + 1);


                        // Normalize Responses with inverse area
                        Dxy *= inv_area;

                        // Calculate Determinant
                        response[ii*width + j] -= 0.81f * Dxy * Dxy;
                        // printf("ii:%d ",ii);
                    }
                }
            }
            // printf("i:%d \n",i);

            for (; i < height; i+=Dxy_stride) {
                int x = i*step;
                for (int j = 0; j < width; j++) {
                    // Image coordinates
                    int y = j*step;

                    // Calculate Dxx, Dyy, Dxy with Box Filter
                    float Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                            + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                            - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                            - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                    // printf("i:%d j:%d ii:%d jj:%d New Filter: %d %d | %d %d | %d %d | %d %d\n", i, j, ii, jj, x - lobe, y + 1, x + 1, y - lobe, x - lobe, y - lobe, x + 1, y + 1);


                    // Normalize Responses with inverse area
                    Dxy *= inv_area;

                    // Calculate Determinant
                    response[i*width + j] -= 0.81f * Dxy * Dxy;

                }

            }
        }
    }
        /**/
        /*
        for (; i_offset<Dxy_stride; i_offset+=1) {
            // printf("j_offset: %d ", j_offset);
            for (int i = i_offset; i < height; i+=Dxy_stride) {
                int x = i*step;
                for (int j = 0; j < width; j+=1) {
                    // Image coordinates
                    int y = j*step;

                    // Calculate Dxx, Dyy, Dxy with Box Filter
                    float Dxy = box_integral_unconditional(iimage, x - lobe, y + 1, lobe, lobe)
                            + box_integral_unconditional(iimage, x + 1, y - lobe, lobe, lobe)
                            - box_integral_unconditional(iimage, x - lobe, y - lobe, lobe, lobe)
                            - box_integral_unconditional(iimage, x + 1, y + 1, lobe, lobe);

                    // printf("i:%d j:%d ii:%d jj:%d New Filter: %d %d | %d %d | %d %d | %d %d\n", i, j, ii, jj, x - lobe, y + 1, x + 1, y - lobe, x - lobe, y - lobe, x + 1, y + 1);


                    // Normalize Responses with inverse area
                    Dxy *= inv_area;

                    // Calculate Determinant
                    response[i*width + j] -= 0.81f * Dxy * Dxy;

                }

            }
        }
        */
    // }
}